

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O0

string * __thiscall
tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char *__s;
  Hex<4UL> local_40 [3];
  allocator<char> local_21;
  char *local_20;
  char *name;
  Enum<int,_2UL> *this_local;
  
  name = (char *)this;
  this_local = (Enum<int,_2UL> *)__return_storage_ptr__;
  __s = (char *)(**this)(*(undefined4 *)((long)this + 8));
  local_20 = __s;
  if (__s == (char *)0x0) {
    Hex<4UL>::Hex(local_40,(long)*(int *)((long)this + 8));
    Hex<4ul>::toString_abi_cxx11_(__return_storage_ptr__,local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString (void) const
	{
		const char* name = m_getName(m_value);
		if (name)
			return std::string(name);
		else
			return Hex<NumBytes*2>((deUint64)m_value).toString();
	}